

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O1

wchar_t node_lookup(EditLine *el,wchar_t *str,keymacro_node_t *ptr,size_t cnt)

{
  keymacro_node_t **ppkVar1;
  wchar_t *pwVar2;
  wchar_t *key;
  ssize_t sVar3;
  
  while( true ) {
    while( true ) {
      if (ptr == (keymacro_node_t *)0x0) {
        return L'\xffffffff';
      }
      if ((str == (wchar_t *)0x0) || (*str == L'\0')) {
        node_enum(el,ptr,cnt);
        return L'\0';
      }
      if (ptr->ch == *str) break;
      ppkVar1 = &ptr->sibling;
      ptr = *ppkVar1;
      if (*ppkVar1 == (keymacro_node_t *)0x0) {
        return L'\xffffffff';
      }
    }
    sVar3 = ct_visual_char((el->el_keymacro).buf + cnt,0x400 - cnt,ptr->ch);
    if (sVar3 == -1) {
      return L'\xffffffff';
    }
    str = str + 1;
    if (ptr->next == (keymacro_node_t *)0x0) break;
    cnt = cnt + sVar3;
    ptr = ptr->next;
  }
  if (*str == L'\0') {
    key = (el->el_keymacro).buf;
    pwVar2 = key + sVar3 + cnt;
    pwVar2[0] = L'\"';
    pwVar2[1] = L'\0';
    keymacro_kprint(el,key,&ptr->val,ptr->type);
    return L'\0';
  }
  return L'\xffffffff';
}

Assistant:

static int
node_lookup(EditLine *el, const wchar_t *str, keymacro_node_t *ptr,
    size_t cnt)
{
	ssize_t used;

	if (ptr == NULL)
		return -1;	/* cannot have null ptr */

	if (!str || *str == 0) {
		/* no more chars in str.  node_enum from here. */
		(void) node_enum(el, ptr, cnt);
		return 0;
	} else {
		/* If match put this char into el->el_keymacro.buf.  Recurse */
		if (ptr->ch == *str) {
			/* match found */
			used = ct_visual_char(el->el_keymacro.buf + cnt,
			    KEY_BUFSIZ - cnt, ptr->ch);
			if (used == -1)
				return -1; /* ran out of buffer space */
			if (ptr->next != NULL)
				/* not yet at leaf */
				return (node_lookup(el, str + 1, ptr->next,
				    (size_t)used + cnt));
			else {
			    /* next node is null so key should be complete */
				if (str[1] == 0) {
					size_t px = cnt + (size_t)used;
					el->el_keymacro.buf[px] = '"';
					el->el_keymacro.buf[px + 1] = '\0';
					keymacro_kprint(el, el->el_keymacro.buf,
					    &ptr->val, ptr->type);
					return 0;
				} else
					return -1;
					/* mismatch -- str still has chars */
			}
		} else {
			/* no match found try sibling */
			if (ptr->sibling)
				return (node_lookup(el, str, ptr->sibling,
				    cnt));
			else
				return -1;
		}
	}
}